

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_merge.hpp
# Opt level: O0

void __thiscall
optimization::const_merge::Env::add_usepoint(Env *this,VarId *var,LabelId labelId,int idx)

{
  size_type sVar1;
  pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  *this_00;
  value_type *__x;
  map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  *in_RSI;
  long in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>,_bool>
  pVar2;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  value_type *in_stack_ffffffffffffff58;
  map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  *in_stack_ffffffffffffff60;
  key_type *in_stack_ffffffffffffff68;
  pair<int,_int> local_80;
  _Base_ptr local_78;
  undefined1 local_70;
  key_type local_58;
  undefined8 local_48;
  int local_18;
  int local_14 [5];
  
  sVar1 = std::
          map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
          ::count(in_stack_ffffffffffffff60,&in_stack_ffffffffffffff58->first);
  if (sVar1 == 0) {
    this_00 = (pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
               *)(in_RDI + 8);
    local_58.super_Displayable._vptr_Displayable = (_func_int **)0x0;
    local_58.id = 0;
    local_58._12_4_ = 0;
    local_48 = 0;
    in_stack_ffffffffffffff68 = &local_58;
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x19b8d8);
    std::
    pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::
    pair<mir::inst::VarId_&,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_true>
              (this_00,&in_stack_ffffffffffffff58->first,
               (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
               CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    pVar2 = std::
            map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
            ::insert((map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                      *)this_00,in_stack_ffffffffffffff58);
    local_78 = (_Base_ptr)pVar2.first._M_node;
    in_stack_ffffffffffffff57 = pVar2.second;
    local_70 = in_stack_ffffffffffffff57;
    std::
    pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::~pair((pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
             *)0x19b924);
    std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
              ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)this_00);
  }
  __x = (value_type *)
        std::
        map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
        ::at(in_RSI,in_stack_ffffffffffffff68);
  std::pair<int,_int>::pair<int_&,_int_&,_true>(&local_80,local_14,&local_18);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::push_back
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
             CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),__x);
  return;
}

Assistant:

void add_usepoint(mir::inst::VarId var, mir::types::LabelId labelId,
                    int idx) {
    if (!usepoints.count(var)) {
      usepoints.insert(
          {var, std::vector<std::pair<mir::types::LabelId, int>>()});
    }
    usepoints.at(var).push_back({labelId, idx});
  }